

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_property.c
# Opt level: O3

int setPosition(float *val,mpt_convertable *src)

{
  int iVar1;
  double in_RAX;
  float fVar2;
  double tmp;
  double local_18;
  
  fVar2 = 0.0;
  if (src != (mpt_convertable *)0x0) {
    local_18 = in_RAX;
    iVar1 = (*src->_vptr->convert)(src,0x66,val);
    if (iVar1 < 0) {
      iVar1 = (*src->_vptr->convert)(src,100,&local_18);
      if (iVar1 < 0) {
        return -3;
      }
      fVar2 = 0.0;
      if (iVar1 != 0) {
        fVar2 = (float)local_18;
      }
    }
    else {
      fVar2 = 0.0;
      if (iVar1 != 0) {
        return 0;
      }
    }
  }
  *val = fVar2;
  return 0;
}

Assistant:

static int setPosition(float *val, MPT_INTERFACE(convertable) *src)
{
	double tmp;
	int len;
	if (!src) {
		*val = 0;
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'f', val)) >= 0) {
		if (!len) *val = 0.0f;
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'd', &tmp)) >= 0) {
		if (!len) {
			*val = 0.0f;
		} else {
			*val = tmp;
		}
		return 0;
	}
	return MPT_ERROR(BadType);
}